

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::AssertionNode::AnnotatePass1
          (AssertionNode *this,Compiler *compiler,bool parentNotInLoop,bool parentAtLeastOnce,
          bool parentNotSpeculative,bool parentNotNegated)

{
  ThreadContext *this_00;
  CharSet<char16_t> *pCVar1;
  byte local_1d;
  bool parentNotNegated_local;
  bool parentNotSpeculative_local;
  bool parentAtLeastOnce_local;
  bool parentNotInLoop_local;
  Compiler *compiler_local;
  AssertionNode *this_local;
  
  this_00 = Js::ScriptContext::GetThreadContext(compiler->scriptContext);
  ThreadContext::ProbeStackNoDispose(this_00,0x6000,compiler->scriptContext,(PVOID)0x0);
  (this->super_Node).features = 0x1000;
  local_1d = 0;
  if (parentNotNegated) {
    local_1d = this->isNegation ^ 0xff;
  }
  (*this->body->_vptr_Node[7])
            (this->body,compiler,(ulong)(parentNotInLoop & 1),(ulong)(parentAtLeastOnce & 1),0,
             (ulong)(local_1d & 1));
  (this->super_Node).features = (this->super_Node).features | this->body->features;
  CountDomain::Exact(&(this->super_Node).thisConsumes,0);
  if ((this->isNegation & 1U) == 0) {
    (this->super_Node).firstSet = this->body->firstSet;
  }
  else {
    pCVar1 = StandardChars<char16_t>::GetFullSet(compiler->standardChars);
    (this->super_Node).firstSet = pCVar1;
  }
  *(uint *)&(this->super_Node).field_0xc = *(uint *)&(this->super_Node).field_0xc & 0xfffffffe;
  if ((this->isNegation & 1U) == 0) {
    *(uint *)&(this->super_Node).field_0xc =
         *(uint *)&(this->super_Node).field_0xc & 0xfffffffd |
         (*(uint *)&this->body->field_0xc >> 1 & 1) << 1;
  }
  else {
    *(uint *)&(this->super_Node).field_0xc = *(uint *)&(this->super_Node).field_0xc & 0xfffffffd;
  }
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xffffffef | 0x10;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xffffffdf | 0x20;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xfffffbff | (uint)parentNotInLoop << 10;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xfffff7ff | (uint)parentAtLeastOnce << 0xb;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xffffefff | (uint)parentNotSpeculative << 0xc;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xffffdfff | (uint)parentNotNegated << 0xd;
  return;
}

Assistant:

void AssertionNode::AnnotatePass1(Compiler& compiler, bool parentNotInLoop, bool parentAtLeastOnce, bool parentNotSpeculative, bool parentNotNegated)
    {
        PROBE_STACK_NO_DISPOSE(compiler.scriptContext, Js::Constants::MinStackRegex);

        features = HasAssertion;
        body->AnnotatePass1(compiler, parentNotInLoop, parentAtLeastOnce, false, parentNotNegated && !isNegation);
        features |= body->features;
        thisConsumes.Exact(0);
        if (isNegation)
            firstSet = compiler.standardChars->GetFullSet();
        else
            firstSet = body->firstSet;
        isFirstExact = false;
        if (isNegation)
            // This will always fail
            isThisIrrefutable = false;
        else
            // If body is irrefutable overall assertion is irrefutable
            isThisIrrefutable = body->isThisIrrefutable;
        isThisWillNotProgress = true;
        isThisWillNotRegress = true;
        isNotInLoop = parentNotInLoop;
        isAtLeastOnce = parentAtLeastOnce;
        isNotSpeculative = parentNotSpeculative;
        isNotNegated = parentNotNegated;
    }